

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

void __thiscall DiskTableNode::~DiskTableNode(DiskTableNode *this)

{
  SSTable *this_00;
  map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
  *this_01;
  DiskTableNode *this_local;
  
  this_00 = this->_sstable;
  if (this_00 != (SSTable *)0x0) {
    SSTable::~SSTable(this_00);
    operator_delete(this_00,0x40);
  }
  if (this->filter != (Filter *)0x0) {
    (*this->filter->_vptr_BloomFilter[1])();
  }
  this_01 = this->index;
  if (this_01 !=
      (map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
       *)0x0) {
    std::
    map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
    ::~map(this_01);
    operator_delete(this_01,0x30);
  }
  return;
}

Assistant:

DiskTableNode::~DiskTableNode() {
    delete _sstable;
    delete filter;
    delete index;
}